

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O3

void __thiscall pybind11::detail::instance::allocate_layout(instance *this)

{
  byte bVar1;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar2;
  void **ppvVar3;
  undefined8 *puVar4;
  long lVar5;
  pointer pptVar6;
  long lVar7;
  
  pvVar2 = all_type_info((this->ob_base).ob_type);
  pptVar6 = (pvVar2->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(pvVar2->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pptVar6 >> 3;
  if (lVar5 == 1) {
    if ((*pptVar6)->holder_size_in_ptrs < 3) {
      (this->field_1).simple_value_holder[0] = (void *)0x0;
      bVar1 = this->field_0x30 & 0xf1 | 2;
      goto LAB_00116756;
    }
  }
  else if (lVar5 == 0) {
    pybind11_fail("instance allocation failed: new instance has no pybind11-registered base types");
  }
  this->field_0x30 = this->field_0x30 & 0xfd;
  lVar7 = 0;
  for (pptVar6 = (pvVar2->
                 super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      (pvVar2->
      super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
      )._M_impl.super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    lVar7 = lVar7 + (*pptVar6)->holder_size_in_ptrs + 1;
  }
  ppvVar3 = (void **)PyMem_Calloc((lVar5 - 1U >> 3) + lVar7 + 1,8);
  (this->field_1).nonsimple.values_and_holders = ppvVar3;
  if (ppvVar3 == (void **)0x0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = PyErr_Clear;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  (this->field_1).simple_value_holder[1] = ppvVar3 + lVar7;
  bVar1 = this->field_0x30;
LAB_00116756:
  this->field_0x30 = bVar1 | 1;
  return;
}

Assistant:

PYBIND11_NOINLINE void instance::allocate_layout() {
    auto &tinfo = all_type_info(Py_TYPE(this));

    const size_t n_types = tinfo.size();

    if (n_types == 0)
        pybind11_fail("instance allocation failed: new instance has no pybind11-registered base types");

    simple_layout =
        n_types == 1 && tinfo.front()->holder_size_in_ptrs <= instance_simple_holder_in_ptrs();

    // Simple path: no python-side multiple inheritance, and a small-enough holder
    if (simple_layout) {
        simple_value_holder[0] = nullptr;
        simple_holder_constructed = false;
        simple_instance_registered = false;
    }
    else { // multiple base types or a too-large holder
        // Allocate space to hold: [v1*][h1][v2*][h2]...[bb...] where [vN*] is a value pointer,
        // [hN] is the (uninitialized) holder instance for value N, and [bb...] is a set of bool
        // values that tracks whether each associated holder has been initialized.  Each [block] is
        // padded, if necessary, to an integer multiple of sizeof(void *).
        size_t space = 0;
        for (auto t : tinfo) {
            space += 1; // value pointer
            space += t->holder_size_in_ptrs; // holder instance
        }
        size_t flags_at = space;
        space += size_in_ptrs(n_types); // status bytes (holder_constructed and instance_registered)

        // Allocate space for flags, values, and holders, and initialize it to 0 (flags and values,
        // in particular, need to be 0).  Use Python's memory allocation functions: in Python 3.6
        // they default to using pymalloc, which is designed to be efficient for small allocations
        // like the one we're doing here; in earlier versions (and for larger allocations) they are
        // just wrappers around malloc.
#if PY_VERSION_HEX >= 0x03050000
        nonsimple.values_and_holders = (void **) PyMem_Calloc(space, sizeof(void *));
        if (!nonsimple.values_and_holders) throw std::bad_alloc();
#else
        nonsimple.values_and_holders = (void **) PyMem_New(void *, space);
        if (!nonsimple.values_and_holders) throw std::bad_alloc();
        std::memset(nonsimple.values_and_holders, 0, space * sizeof(void *));
#endif
        nonsimple.status = reinterpret_cast<std::uint8_t *>(&nonsimple.values_and_holders[flags_at]);
    }
    owned = true;
}